

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeNext(BtCursor *pCur,int *pRes)

{
  char cVar1;
  u16 uVar2;
  uint uVar3;
  MemPage *pMVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  ushort uVar8;
  
  (pCur->info).nSize = 0;
  pCur->curFlags = pCur->curFlags & 0xf9;
  *pRes = 0;
  if (pCur->eState == '\x01') {
    cVar1 = pCur->iPage;
    pMVar4 = pCur->apPage[cVar1];
    uVar2 = pCur->aiIdx[cVar1];
    uVar8 = uVar2 + 1;
    pCur->aiIdx[cVar1] = uVar8;
    if (pMVar4->nCell <= uVar8) {
      pCur->aiIdx[cVar1] = uVar2;
      iVar6 = btreeNext(pCur,pRes);
      return iVar6;
    }
    if (pMVar4->leaf != '\0') {
      return 0;
    }
    iVar6 = 0;
    while( true ) {
      if (iVar6 != 0) {
        return iVar6;
      }
      pMVar4 = pCur->apPage[pCur->iPage];
      if (pMVar4->leaf != '\0') break;
      uVar3 = *(uint *)(pMVar4->aData +
                       (CONCAT11(pMVar4->aCellIdx[(ulong)pCur->aiIdx[pCur->iPage] * 2],
                                 pMVar4->aCellIdx[(ulong)pCur->aiIdx[pCur->iPage] * 2 + 1]) &
                       pMVar4->maskPage));
      iVar6 = moveToChild(pCur,uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                               uVar3 << 0x18);
    }
    return 0;
  }
  bVar5 = pCur->eState;
  if (bVar5 != 1) {
    if (2 < bVar5) {
      iVar6 = btreeRestoreCursorPosition(pCur);
      if (iVar6 != 0) {
        return iVar6;
      }
      bVar5 = pCur->eState;
    }
    if (bVar5 == 0) {
      *pRes = 1;
      return 0;
    }
    iVar6 = pCur->skipNext;
    if (iVar6 != 0) {
      pCur->eState = '\x01';
      pCur->skipNext = 0;
      if (0 < iVar6) {
        return 0;
      }
    }
  }
  lVar7 = (long)pCur->iPage;
  pMVar4 = pCur->apPage[lVar7];
  uVar8 = pCur->aiIdx[lVar7] + 1;
  pCur->aiIdx[lVar7] = uVar8;
  if (uVar8 < pMVar4->nCell) {
    if (pMVar4->leaf == '\0') {
LAB_00132a15:
      iVar6 = moveToLeftmost(pCur);
      return iVar6;
    }
  }
  else {
    if (pMVar4->leaf == '\0') {
      uVar3 = *(uint *)(pMVar4->aData + (ulong)pMVar4->hdrOffset + 8);
      iVar6 = moveToChild(pCur,uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                               uVar3 << 0x18);
      if (iVar6 != 0) {
        return iVar6;
      }
      goto LAB_00132a15;
    }
    do {
      if ((char)lVar7 == '\0') {
        *pRes = 1;
        pCur->eState = '\0';
        return 0;
      }
      moveToParent(pCur);
      lVar7 = (long)pCur->iPage;
    } while (pCur->apPage[lVar7]->nCell <= pCur->aiIdx[lVar7]);
    if (pCur->apPage[lVar7]->intKey != '\0') {
      iVar6 = sqlite3BtreeNext(pCur,pRes);
      return iVar6;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeNext(BtCursor *pCur, int *pRes){
  MemPage *pPage;
  assert( cursorOwnsBtShared(pCur) );
  assert( pRes!=0 );
  assert( *pRes==0 || *pRes==1 );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  *pRes = 0;
  if( pCur->eState!=CURSOR_VALID ) return btreeNext(pCur, pRes);
  pPage = pCur->apPage[pCur->iPage];
  if( (++pCur->aiIdx[pCur->iPage])>=pPage->nCell ){
    pCur->aiIdx[pCur->iPage]--;
    return btreeNext(pCur, pRes);
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}